

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_system.cpp
# Opt level: O2

string * __thiscall
LinearSystem::ToLaTex_abi_cxx11_(string *__return_storage_ptr__,LinearSystem *this)

{
  pointer pOVar1;
  int iVar2;
  ostream *poVar3;
  Matrix *this_00;
  int iVar4;
  int iVar5;
  Operation *operation;
  pointer operation_00;
  int iVar6;
  int iVar7;
  int local_320;
  int local_31c;
  SwapMatrix swaps;
  ostringstream out;
  LinearSystem current_system;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&out);
  LinearSystem(&current_system,&this->start_system_,this->mode_);
  poVar3 = std::operator<<((ostream *)&out,"\\[");
  std::endl<char,std::char_traits<char>>(poVar3);
  poVar3 = operator<<((ostream *)&out,&current_system.system_);
  std::endl<char,std::char_traits<char>>(poVar3);
  swaps.first_row_ = 0;
  swaps.second_row_ = 0;
  swaps.first_main_column_ = 0;
  swaps.second_main_column_ = 0;
  swaps.first_extension_column_ = 0;
  swaps.second_extension_column_ = 0;
  operation_00 = (this->history_).
                 super__Vector_base<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  pOVar1 = (this->history_).
           super__Vector_base<LinearSystem::Operation,_std::allocator<LinearSystem::Operation>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  local_31c = 1;
  iVar2 = 0;
  local_320 = 0;
  iVar6 = 0;
  iVar7 = 0;
  iVar4 = 0;
  iVar5 = 0;
  for (; operation_00 != pOVar1; operation_00 = operation_00 + 1) {
    ApplyOperation(&current_system,operation_00);
    if (operation_00->operation_type == SwapColumns) {
      iVar7 = operation_00->lhs + 1;
      iVar6 = operation_00->rhs + 1;
      swaps.second_main_column_ = iVar6;
      swaps.first_main_column_ = iVar7;
    }
    else if (operation_00->operation_type == SwapRows) {
      iVar5 = operation_00->lhs + 1;
      iVar4 = operation_00->rhs + 1;
      swaps.second_row_ = iVar4;
      swaps.first_row_ = iVar5;
      if (this->mode_ == LU) {
        this_00 = ExtendedMatrix::GetMainMatrix(&this->system_);
        iVar2 = Matrix::GetNumColumns(this_00);
        local_320 = operation_00->lhs + iVar2 + 1;
        iVar2 = iVar2 + 1 + operation_00->rhs;
        swaps.second_extension_column_ = iVar2;
        swaps.first_extension_column_ = local_320;
      }
    }
    if ((Options::step_by_step_type == 2) ||
       ((Options::step_by_step_type == 1 && (operation_00->operation_type == MainOutput)))) {
      if (local_31c == Options::max_matrices_count_in_row) {
        poVar3 = std::operator<<((ostream *)&out,"\\sim");
        std::endl<char,std::char_traits<char>>(poVar3);
        poVar3 = std::operator<<((ostream *)&out,"\\]");
        std::endl<char,std::char_traits<char>>(poVar3);
        poVar3 = std::operator<<((ostream *)&out,"\\[");
        local_31c = 0;
        std::endl<char,std::char_traits<char>>(poVar3);
      }
      if (((iVar5 != iVar4) || (iVar7 != iVar6)) ||
         (iVar5 = iVar4, iVar7 = iVar6, local_320 != iVar2)) {
        poVar3 = std::operator<<((ostream *)&out,"\\sim");
        operator<<(poVar3,&swaps);
        swaps.first_extension_column_ = 0;
        swaps.second_extension_column_ = 0;
        swaps.first_row_ = 0;
        swaps.second_row_ = 0;
        swaps.first_main_column_ = 0;
        swaps.second_main_column_ = 0;
        iVar2 = 0;
        iVar7 = 0;
        iVar5 = 0;
      }
      poVar3 = std::operator<<((ostream *)&out,"\\sim");
      poVar3 = operator<<(poVar3,&current_system.system_);
      std::endl<char,std::char_traits<char>>(poVar3);
      local_31c = local_31c + 1;
      iVar4 = iVar5;
      iVar6 = iVar7;
      local_320 = iVar2;
    }
  }
  std::operator<<((ostream *)&out,"\\]");
  std::__cxx11::stringbuf::str();
  ~LinearSystem(&current_system);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&out);
  return __return_storage_ptr__;
}

Assistant:

std::string LinearSystem::ToLaTex() const {
  std::ostringstream out;
  LinearSystem current_system(start_system_, mode_);

  out << "\\[" << std::endl;
  out << current_system.system_ << std::endl;

  SwapMatrix swaps;
  int matrices_count_in_row = 1;
  for (const auto& operation : history_) {
    current_system.ApplyOperation(operation);

    if (operation.operation_type == OperationType::SwapRows) {
      swaps.SetRowSwap(operation.lhs, operation.rhs);
      if (mode_ == Mode::LU) {
        int m = system_.GetMainMatrix().GetNumColumns();
        swaps.SetExtensionColumnSwap(operation.lhs + m, operation.rhs + m);
      }
    } else if (operation.operation_type == OperationType::SwapColumns) {
      swaps.SetMainColumnSwap(operation.lhs, operation.rhs);
    }

    if (Options::step_by_step_type != Options::StepByStepType::AllSteps &&
        (Options::step_by_step_type != Options::StepByStepType::MainSteps ||
         operation.operation_type != OperationType::MainOutput)) {
      continue;
    }

    if (matrices_count_in_row == Options::max_matrices_count_in_row) {
      out << "\\sim" << std::endl;
      out << "\\]" << std::endl;
      out << "\\[" << std::endl;
      matrices_count_in_row = 0;
    }

    if (!swaps.IsEmpty()) {
      out << "\\sim" << swaps;
      swaps.Clear();
    }

    out << "\\sim" << current_system.system_ << std::endl;
    ++matrices_count_in_row;
  }

  out << "\\]";

  return out.str();
}